

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_invis(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int sn_00;
  int sn_01;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA local_98;
  
  sn_00 = skill_lookup("faerie fog");
  sn_01 = skill_lookup("faerie fire");
  bVar1 = is_affected(ch,sn_00);
  if (!bVar1) {
    bVar1 = is_affected(ch,sn_01);
    if (!bVar1) {
      if (target != 1) {
        bVar1 = is_affected_by((CHAR_DATA *)vo,1);
        if (!bVar1) {
          act("$n fades out of existence.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
          init_affect(&local_98);
          local_98.where = 0;
          local_98.aftype = 0;
          local_98.type = (short)sn;
          local_98.duration = (short)level + 0xc;
          local_98.location = 0;
          local_98.modifier = 0;
          local_98.bitvector[0]._0_1_ = (byte)local_98.bitvector[0] | 2;
          local_98.mod_name = 5;
          local_98.level = (short)level;
          affect_to_char((CHAR_DATA *)vo,&local_98);
          send_to_char("You fade out of existence.\n\r",(CHAR_DATA *)vo);
        }
        return;
      }
      txt = "You must be crazy.\n\r";
      goto LAB_002aee57;
    }
  }
  txt = "You can\'t turn invisible while glowing.\n\r";
LAB_002aee57:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_invis(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;
	AFFECT_DATA af;
	int sn_fog, sn_fire;

	sn_fog = skill_lookup("faerie fog");
	sn_fire = skill_lookup("faerie fire");

	if (is_affected(ch, sn_fog) || is_affected(ch, sn_fire))
	{
		send_to_char("You can't turn invisible while glowing.\n\r", ch);
		return;
	}

	if (target == TARGET_OBJ)
	{
		send_to_char("You must be crazy.\n\r", ch);
		return;
	}
	/* character invisibility */
	victim = (CHAR_DATA *)vo;

	if (is_affected_by(victim, AFF_INVISIBLE))
		return;

	act("$n fades out of existence.", victim, nullptr, nullptr, TO_ROOM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = level + 12;
	af.location = APPLY_NONE;
	af.modifier = 0;

	SET_BIT(af.bitvector, AFF_INVISIBLE);

	af.mod_name = MOD_VISIBILITY;
	affect_to_char(victim, &af);

	send_to_char("You fade out of existence.\n\r", victim);
}